

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness
          (DescriptorBuilder *this,EnumDescriptorProto *proto,EnumDescriptor *result)

{
  ushort *puVar1;
  undefined8 *puVar2;
  pointer pcVar3;
  size_type sVar4;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  ctrl_t *pcVar5;
  anon_union_8_1_a8a14541_for_iterator_2 aVar6;
  bool bVar7;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
  *ppVar8;
  pointer prVar9;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *pVVar10;
  EnumValueDescriptor **ppEVar11;
  EnumDescriptor *this_00;
  slot_type *psVar12;
  ulong uVar13;
  EnumValueDescriptor **ppEVar14;
  ulong uVar15;
  long lVar16;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view element_name;
  string_view element_name_00;
  anon_class_16_2_17ec71fb make_error;
  EnumValueDescriptor *value;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
  insert_result;
  string stripped;
  PrefixRemover remover;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  values;
  allocator<char> local_111;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  EnumValueDescriptor *local_100;
  EnumDescriptorProto *local_f8;
  DescriptorBuilder *local_f0;
  ulong local_e8;
  EnumDescriptor *local_e0;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
  local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 *local_98;
  ulong local_90;
  undefined1 local_88 [16];
  VoidPtr local_78;
  code *pcStack_70;
  VoidPtr local_68;
  code *pcStack_60;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  local_58;
  
  puVar1 = (ushort *)(result->all_names_).payload_;
  local_98 = local_88;
  local_90 = 0;
  local_88[0] = 0;
  local_f8 = proto;
  local_f0 = this;
  local_e0 = result;
  for (lVar16 = -(ulong)*puVar1; lVar16 != 0; lVar16 = lVar16 + 1) {
    if (*(char *)((long)puVar1 + lVar16 + -1) != '_') {
      std::__cxx11::string::push_back((char)&local_98);
    }
  }
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  local_f8 = (EnumDescriptorProto *)((long)&local_f8->field_0 + 8);
  uVar13 = 0;
  this_00 = local_e0;
  do {
    if (this_00->value_count_ <= (int)uVar13) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
      ::~raw_hash_set(&local_58);
      std::__cxx11::string::~string((string *)&local_98);
      return;
    }
    local_e8 = uVar13;
    local_100 = EnumDescriptor::value(this_00,(int)uVar13);
    local_110._M_str = (local_100->all_names_->_M_dataplus)._M_p;
    local_110._M_len = local_100->all_names_->_M_string_length;
    ppEVar14 = (EnumValueDescriptor **)0x0;
    uVar13 = 0;
    ppVar8 = (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
              *)local_110._M_str;
    ppEVar11 = (EnumValueDescriptor **)local_110._M_len;
    while ((ppEVar14 < local_110._M_len && (uVar13 < local_90))) {
      uVar15 = (ulong)*(byte *)((long)&(((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
                                          *)local_110._M_str)->first).ctrl_ + (long)ppEVar14);
      if (uVar15 != 0x5f) {
        if (absl::lts_20250127::ascii_internal::kToLower[uVar15] != local_98[uVar13]) {
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&local_d8,&local_110,&local_111);
          goto LAB_0013d430;
        }
        uVar13 = uVar13 + 1;
      }
      ppEVar14 = (EnumValueDescriptor **)((long)ppEVar14 + 1);
      ppVar8 = (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
                *)((long)&(ppVar8->first).ctrl_ + 1);
      ppEVar11 = (EnumValueDescriptor **)((long)ppEVar11 - 1);
    }
    if (uVar13 < local_90) {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_d8,&local_110,&local_111);
    }
    else {
      while (ppEVar11 != (EnumValueDescriptor **)0x0) {
        if (*(char *)&(ppVar8->first).ctrl_ != '_') {
          local_110._M_len = (size_t)ppEVar11;
          local_110._M_str = (char *)ppVar8;
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&local_d8,&local_110,&local_111);
          goto LAB_0013d430;
        }
        ppVar8 = (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
                  *)((long)&(ppVar8->first).ctrl_ + 1);
        ppEVar11 = (EnumValueDescriptor **)((long)ppEVar11 - 1);
      }
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_d8,&local_110,&local_111);
    }
LAB_0013d430:
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&local_b8);
    aVar6 = local_d8.first.field_1;
    pcVar5 = local_d8.first.ctrl_;
    for (psVar12 = (slot_type *)0x0; aVar6.slot_ != psVar12;
        psVar12 = (slot_type *)((long)&(psVar12->value).first._M_dataplus._M_p + 1)) {
      if (pcVar5[(long)psVar12] != 0x5f) {
        std::__cxx11::string::push_back((char)&local_b8);
      }
    }
    std::__cxx11::string::~string((string *)&local_d8);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::EnumValueDescriptor_const*>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>>
    ::try_emplace_impl<std::__cxx11::string_const&,google::protobuf::EnumValueDescriptor_const*&>
              (&local_d8,&local_58,&local_b8,&local_100);
    this_00 = local_e0;
    if (local_d8.second == false) {
      prVar9 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
               ::iterator::operator->(&local_d8.first);
      puVar2 = (undefined8 *)
               (prVar9->second->super_Message).super_MessageLite._internal_metadata_.ptr_;
      __x._M_str = (char *)*puVar2;
      __x._M_len = puVar2[1];
      __y._M_str = (local_100->all_names_->_M_dataplus)._M_p;
      __y._M_len = local_100->all_names_->_M_string_length;
      bVar7 = std::operator!=(__x,__y);
      if ((bVar7) &&
         (prVar9 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                   ::iterator::operator->(&local_d8.first),
         *(int *)((long)&(prVar9->second->super_Message).super_MessageLite._vptr_MessageLite + 4) !=
         local_100->number_)) {
        local_110._M_len = (size_t)&local_100;
        local_110._M_str = (char *)&local_d8;
        if (((local_f0->pool_->deprecated_legacy_json_field_conflicts_ == false) &&
            ((this_00->options_->field_0)._impl_.deprecated_legacy_json_field_conflicts_ != true))
           || (this_00->file_->edition_ != EDITION_PROTO2)) {
          pcVar3 = local_100->all_names_[1]._M_dataplus._M_p;
          sVar4 = local_100->all_names_[1]._M_string_length;
          pVVar10 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                              ((RepeatedPtrFieldBase *)local_f8,(int)local_e8);
          pcStack_70 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness(google::protobuf::EnumDescriptorProto_const&,google::protobuf::EnumDescriptor_const*)::__0,std::__cxx11::string>
          ;
          local_78.obj = &local_110;
          make_error_01.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness(google::protobuf::EnumDescriptorProto_const&,google::protobuf::EnumDescriptor_const*)::__0,std::__cxx11::string>
          ;
          make_error_01.ptr_.obj = local_78.obj;
          element_name_00._M_str = pcVar3;
          element_name_00._M_len = sVar4;
          AddError(local_f0,element_name_00,&pVVar10->super_Message,NAME,make_error_01);
        }
        else {
          pcVar3 = local_100->all_names_[1]._M_dataplus._M_p;
          sVar4 = local_100->all_names_[1]._M_string_length;
          pVVar10 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                              ((RepeatedPtrFieldBase *)local_f8,(int)local_e8);
          pcStack_60 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness(google::protobuf::EnumDescriptorProto_const&,google::protobuf::EnumDescriptor_const*)::__0,std::__cxx11::string>
          ;
          local_68.obj = &local_110;
          make_error_00.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness(google::protobuf::EnumDescriptorProto_const&,google::protobuf::EnumDescriptor_const*)::__0,std::__cxx11::string>
          ;
          make_error_00.ptr_.obj = local_68.obj;
          element_name._M_str = pcVar3;
          element_name._M_len = sVar4;
          AddWarning(local_f0,element_name,&pVVar10->super_Message,NAME,make_error_00);
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_b8);
    uVar13 = (ulong)((int)local_e8 + 1);
  } while( true );
}

Assistant:

void DescriptorBuilder::CheckEnumValueUniqueness(
    const EnumDescriptorProto& proto, const EnumDescriptor* result) {

  // Check that enum labels are still unique when we remove the enum prefix from
  // values that have it.
  //
  // This will fail for something like:
  //
  //   enum MyEnum {
  //     MY_ENUM_FOO = 0;
  //     FOO = 1;
  //   }
  //
  // By enforcing this reasonable constraint, we allow code generators to strip
  // the prefix and/or PascalCase it without creating conflicts.  This can lead
  // to much nicer language-specific enums like:
  //
  //   enum NameType {
  //     FirstName = 1,
  //     LastName = 2,
  //   }
  //
  // Instead of:
  //
  //   enum NameType {
  //     NAME_TYPE_FIRST_NAME = 1,
  //     NAME_TYPE_LAST_NAME = 2,
  //   }
  PrefixRemover remover(result->name());
  absl::flat_hash_map<std::string, const EnumValueDescriptor*> values;
  for (int i = 0; i < result->value_count(); i++) {
    const EnumValueDescriptor* value = result->value(i);
    std::string stripped =
        EnumValueToPascalCase(remover.MaybeRemove(value->name()));
    auto insert_result = values.try_emplace(stripped, value);
    bool inserted = insert_result.second;

    // We don't throw the error if the two conflicting symbols are identical, or
    // if they map to the same number.  In the former case, the normal symbol
    // duplication error will fire so we don't need to (and its error message
    // will make more sense). We allow the latter case so users can create
    // aliases which add or remove the prefix (code generators that do prefix
    // stripping should de-dup the labels in this case).
    if (!inserted && insert_result.first->second->name() != value->name() &&
        insert_result.first->second->number() != value->number()) {
      auto make_error = [&] {
        return absl::StrFormat(
            "Enum name %s has the same name as %s if you ignore case and strip "
            "out the enum name prefix (if any). (If you are using allow_alias, "
            "please assign the same number to each enum value name.)",
            value->name(), insert_result.first->second->name());
      };
      // There are proto2 enums out there with conflicting names, so to preserve
      // compatibility we issue only a warning for proto2.
      if ((pool_->deprecated_legacy_json_field_conflicts_ ||
           IsLegacyJsonFieldConflictEnabled(result->options())) &&
          result->file()->edition() == Edition::EDITION_PROTO2) {
        AddWarning(value->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NAME, make_error);
        continue;
      }
      AddError(value->full_name(), proto.value(i),
               DescriptorPool::ErrorCollector::NAME, make_error);
    }
  }
}